

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_proper_context_tests(int use_prealloc)

{
  int iVar1;
  secp256k1_context *sigr_00;
  size_t sVar2;
  secp256k1_context *a;
  secp256k1_context *psVar3;
  int in_EDI;
  void *prealloc_tmp;
  secp256k1_context *ctx_tmp;
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar nonce;
  secp256k1_scalar key;
  secp256k1_scalar msg;
  secp256k1_ge pub;
  secp256k1_gej pubj;
  uchar seed [32];
  void *my_ctx_prealloc;
  secp256k1_context *my_ctx_fresh;
  secp256k1_context *my_ctx;
  int32_t dummy;
  secp256k1_context *in_stack_fffffffffffffdf8;
  secp256k1_context *in_stack_fffffffffffffe00;
  secp256k1_context *in_stack_fffffffffffffe08;
  secp256k1_scalar *in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe4c;
  secp256k1_gej *in_stack_fffffffffffffe58;
  secp256k1_ge *in_stack_fffffffffffffe60;
  secp256k1_scalar *in_stack_ffffffffffffff48;
  secp256k1_scalar *in_stack_ffffffffffffff50;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff60;
  secp256k1_scalar *in_stack_ffffffffffffff68;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff80;
  secp256k1_scalar *message;
  secp256k1_ge *in_stack_ffffffffffffffd8;
  secp256k1_scalar *sigs_00;
  secp256k1_context *local_10;
  undefined4 local_8;
  int local_4;
  
  local_8 = 0;
  sigs_00 = (secp256k1_scalar *)0x0;
  message = (secp256k1_scalar *)0x0;
  local_4 = in_EDI;
  sigr_00 = secp256k1_context_create((uint)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  if (local_4 == 0) {
    local_10 = secp256k1_context_create((uint)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  }
  else {
    sVar2 = secp256k1_context_preallocated_size(in_stack_fffffffffffffe4c);
    sigs_00 = (secp256k1_scalar *)malloc(sVar2);
    if (sigs_00 == (secp256k1_scalar *)0x0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xff,"test condition failed: my_ctx_prealloc != NULL");
      abort();
    }
    local_10 = secp256k1_context_preallocated_create
                         (in_stack_fffffffffffffe08,(uint)((ulong)in_stack_fffffffffffffe00 >> 0x20)
                         );
  }
  iVar1 = context_eq(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x106,"test condition failed: context_eq(my_ctx, my_ctx_fresh)");
    abort();
  }
  iVar1 = secp256k1_context_randomize(in_stack_fffffffffffffdf8,(uchar *)0x10e8df);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x107,"test condition failed: secp256k1_context_randomize(my_ctx, seed) == 1");
    abort();
  }
  iVar1 = context_eq(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x108,"test condition failed: !context_eq(my_ctx, my_ctx_fresh)");
    abort();
  }
  iVar1 = secp256k1_context_randomize(in_stack_fffffffffffffdf8,(uchar *)0x10e99d);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x109,"test condition failed: secp256k1_context_randomize(my_ctx, NULL) == 1");
    abort();
  }
  iVar1 = context_eq(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10a,"test condition failed: context_eq(my_ctx, my_ctx_fresh)");
    abort();
  }
  secp256k1_context_set_error_callback
            (in_stack_fffffffffffffe00,(_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,
             (void *)0x10ea5e);
  if ((local_10->error_callback).fn == secp256k1_default_error_callback_fn) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10e,
            "test condition failed: my_ctx->error_callback.fn != secp256k1_default_error_callback_fn"
           );
    abort();
  }
  if ((local_10->error_callback).fn != secp256k1_default_illegal_callback_fn) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x10f,
            "test condition failed: my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn"
           );
    abort();
  }
  a = (secp256k1_context *)secp256k1_context_preallocated_clone_size(in_stack_fffffffffffffdf8);
  psVar3 = (secp256k1_context *)secp256k1_context_preallocated_size(in_stack_fffffffffffffe4c);
  if (a != psVar3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x112,
            "test condition failed: secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE)"
           );
    abort();
  }
  if (local_4 == 0) {
    sVar2 = secp256k1_context_preallocated_size(in_stack_fffffffffffffe4c);
    psVar3 = (secp256k1_context *)malloc(sVar2);
    if (psVar3 == (secp256k1_context *)0x0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,299,"test condition failed: prealloc_tmp != NULL");
      abort();
    }
    secp256k1_context_preallocated_clone(psVar3,a);
    iVar1 = context_eq(a,in_stack_fffffffffffffdf8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x12e,"test condition failed: context_eq(ctx_tmp, my_ctx)");
      abort();
    }
    secp256k1_context_destroy(a);
    local_10 = secp256k1_context_clone(psVar3);
    iVar1 = context_eq(a,in_stack_fffffffffffffdf8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x133,"test condition failed: context_eq(ctx_tmp, my_ctx)");
      abort();
    }
    secp256k1_context_preallocated_destroy(a);
    free(psVar3);
  }
  else {
    secp256k1_context_clone(in_stack_fffffffffffffe08);
    iVar1 = context_eq(a,in_stack_fffffffffffffdf8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x11c,"test condition failed: context_eq(ctx_tmp, my_ctx)");
      abort();
    }
    secp256k1_context_preallocated_destroy(a);
    free(sigs_00);
    sVar2 = secp256k1_context_preallocated_size(in_stack_fffffffffffffe4c);
    sigs_00 = (secp256k1_scalar *)malloc(sVar2);
    if (sigs_00 == (secp256k1_scalar *)0x0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x121,"test condition failed: my_ctx_prealloc != NULL");
      abort();
    }
    local_10 = secp256k1_context_preallocated_clone(in_stack_fffffffffffffe08,a);
    iVar1 = context_eq(a,in_stack_fffffffffffffdf8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x124,"test condition failed: context_eq(ctx_tmp, my_ctx)");
      abort();
    }
    secp256k1_context_destroy(a);
  }
  if ((local_10->error_callback).fn == secp256k1_default_error_callback_fn) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13a,
            "test condition failed: my_ctx->error_callback.fn != secp256k1_default_error_callback_fn"
           );
    abort();
  }
  if ((local_10->error_callback).fn != secp256k1_default_illegal_callback_fn) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13b,
            "test condition failed: my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn"
           );
    abort();
  }
  secp256k1_context_set_error_callback
            (a,(_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,(void *)0x10ef76);
  if ((local_10->error_callback).fn != secp256k1_default_error_callback_fn) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13e,
            "test condition failed: my_ctx->error_callback.fn == secp256k1_default_error_callback_fn"
           );
    abort();
  }
  iVar1 = context_eq(a,in_stack_fffffffffffffdf8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x13f,"test condition failed: context_eq(my_ctx, my_ctx_fresh)");
    abort();
  }
  secp256k1_context_set_illegal_callback
            (a,(_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,(void *)0x10f04e);
  if ((local_10->illegal_callback).fn != counting_callback_fn) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x143,"test condition failed: my_ctx->illegal_callback.fn == counting_callback_fn");
    abort();
  }
  if ((undefined4 *)(local_10->illegal_callback).data != &local_8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x144,"test condition failed: my_ctx->illegal_callback.data == &dummy");
    abort();
  }
  secp256k1_context_set_illegal_callback
            (a,(_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffdf8,(void *)0x10f11d);
  if ((local_10->illegal_callback).fn != secp256k1_default_illegal_callback_fn) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x146,
            "test condition failed: my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn"
           );
    abort();
  }
  if ((local_10->illegal_callback).data != (void *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x147,"test condition failed: my_ctx->illegal_callback.data == NULL");
    abort();
  }
  iVar1 = context_eq(a,in_stack_fffffffffffffdf8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x148,"test condition failed: context_eq(my_ctx, my_ctx_fresh)");
    abort();
  }
  testutil_random_scalar_order_test(in_stack_fffffffffffffe20);
  testutil_random_scalar_order_test(in_stack_fffffffffffffe20);
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  do {
    testutil_random_scalar_order_test(in_stack_fffffffffffffe20);
    iVar1 = secp256k1_ecdsa_sig_sign
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (secp256k1_scalar *)in_stack_ffffffffffffff60,
                       (secp256k1_scalar *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48,in_stack_ffffffffffffff80);
  } while (iVar1 == 0);
  iVar1 = secp256k1_ecdsa_sig_sign
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (secp256k1_scalar *)in_stack_ffffffffffffff60,
                     (secp256k1_scalar *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff80);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x156,
            "test condition failed: secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL)"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)sigr_00,sigs_00,in_stack_ffffffffffffffd8,message);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x159,"test condition failed: secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg)");
    abort();
  }
  if (local_4 == 0) {
    secp256k1_context_destroy(a);
  }
  else {
    secp256k1_context_preallocated_destroy(a);
    free(sigs_00);
  }
  secp256k1_context_destroy(a);
  secp256k1_context_destroy(a);
  secp256k1_context_preallocated_destroy(a);
  return;
}

Assistant:

static void run_proper_context_tests(int use_prealloc) {
    int32_t dummy = 0;
    secp256k1_context *my_ctx, *my_ctx_fresh;
    void *my_ctx_prealloc = NULL;
    unsigned char seed[32] = {0x17};

    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar msg, key, nonce;
    secp256k1_scalar sigr, sigs;

    /* Fresh reference context for comparison */
    my_ctx_fresh = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (use_prealloc) {
        my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
        CHECK(my_ctx_prealloc != NULL);
        my_ctx = secp256k1_context_preallocated_create(my_ctx_prealloc, SECP256K1_CONTEXT_NONE);
    } else {
        my_ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    }

    /* Randomize and reset randomization */
    CHECK(context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, seed) == 1);
    CHECK(!context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, NULL) == 1);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* set error callback (to a function that still aborts in case malloc() fails in secp256k1_context_clone() below) */
    secp256k1_context_set_error_callback(my_ctx, secp256k1_default_illegal_callback_fn, NULL);
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);

    /* check if sizes for cloning are consistent */
    CHECK(secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));

    /*** clone and destroy all of them to make sure cloning was complete ***/
    {
        secp256k1_context *ctx_tmp;

        if (use_prealloc) {
            /* clone into a non-preallocated context and then again into a new preallocated one. */
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);

            free(my_ctx_prealloc);
            my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(my_ctx_prealloc != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, my_ctx_prealloc);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);
        } else {
            /* clone into a preallocated context and then again into a new non-preallocated one. */
            void *prealloc_tmp;

            prealloc_tmp = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(prealloc_tmp != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, prealloc_tmp);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);

            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);
            free(prealloc_tmp);
        }
    }

    /* Verify that the error callback makes it across the clone. */
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);
    /* And that it resets back to default. */
    secp256k1_context_set_error_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_error_callback_fn);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* Verify that setting and resetting illegal callback works */
    secp256k1_context_set_illegal_callback(my_ctx, counting_callback_fn, &dummy);
    CHECK(my_ctx->illegal_callback.fn == counting_callback_fn);
    CHECK(my_ctx->illegal_callback.data == &dummy);
    secp256k1_context_set_illegal_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == NULL);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /*** attempt to use them ***/
    testutil_random_scalar_order_test(&msg);
    testutil_random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&my_ctx->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);

    /* obtain a working nonce */
    do {
        testutil_random_scalar_order_test(&nonce);
    } while(!secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try signing */
    CHECK(secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try verifying */
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));

    /* cleanup */
    if (use_prealloc) {
        secp256k1_context_preallocated_destroy(my_ctx);
        free(my_ctx_prealloc);
    } else {
        secp256k1_context_destroy(my_ctx);
    }
    secp256k1_context_destroy(my_ctx_fresh);

    /* Defined as no-op. */
    secp256k1_context_destroy(NULL);
    secp256k1_context_preallocated_destroy(NULL);
}